

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O2

void cft_fasttext_labels_free(fasttext_labels_t *labels)

{
  size_t i;
  ulong uVar1;
  
  if (labels != (fasttext_labels_t *)0x0) {
    for (uVar1 = 0; uVar1 < labels->length; uVar1 = uVar1 + 1) {
      free(labels->labels[uVar1]);
    }
    free(labels->labels);
    free(labels->freqs);
    free(labels);
    return;
  }
  return;
}

Assistant:

void cft_fasttext_labels_free(fasttext_labels_t* labels) {
    if (labels == nullptr) {
        return;
    }
    for (size_t i = 0; i < labels->length; i++) {
        free(labels->labels[i]);
    }
    free(labels->labels);
    free(labels->freqs);
    free(labels);
}